

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O3

bool __thiscall pbrt::SquareMatrix<4>::operator<(SquareMatrix<4> *this,SquareMatrix<4> *m2)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  
  bVar5 = true;
  uVar3 = 0;
  do {
    lVar4 = 0;
    do {
      fVar1 = (*(Float (*) [4])*(Float (*) [4])this)[lVar4];
      fVar2 = (*(Float (*) [4])*(Float (*) [4])m2)[lVar4];
      if (fVar1 != fVar2) goto LAB_002d3e63;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    bVar5 = uVar3 < 3;
    uVar3 = uVar3 + 1;
    this = (SquareMatrix<4> *)((long)this + 0x10);
    m2 = (SquareMatrix<4> *)((long)m2 + 0x10);
  } while (uVar3 != 4);
  bVar5 = false;
LAB_002d3e63:
  return (bool)(fVar1 < fVar2 & bVar5);
}

Assistant:

PBRT_CPU_GPU
    bool operator<(const SquareMatrix<N> &m2) const {
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j) {
                if (m[i][j] < m2.m[i][j])
                    return true;
                if (m[i][j] > m2.m[i][j])
                    return false;
            }
        return false;
    }